

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

void * SZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  SRes rc;
  UInt32 UVar2;
  PHYSFS_ErrorCode PVar3;
  PHYSFS_uint64 PVar4;
  PHYSFS_sint64 PVar5;
  SZIPinfo *info;
  CSzAr *pCVar6;
  long lVar7;
  UInt32 *allocMain;
  ISzAlloc *alloc;
  ISzAlloc *in_R8;
  CSzAr *pCVar8;
  CSzAr *pCVar9;
  PHYSFS_Io *io_1;
  UInt64 type;
  PHYSFS_uint8 sig [6];
  CSzData sd;
  size_t processed;
  Byte header [32];
  ISzAlloc *in_stack_ffffffffffffbea8;
  CSzAr *local_4150;
  UInt64 local_4140;
  uint local_4134;
  int local_412e;
  short local_412a;
  CBuf local_4128;
  size_t **local_4110;
  ISzAlloc local_4108;
  CSzAr local_40f8;
  undefined1 local_40a8 [20];
  CSzAr *local_4094;
  uint local_408c;
  code *local_4080;
  code *local_4078;
  PHYSFS_Io *local_4070;
  ILookInStream local_4068;
  code **local_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  
  if (forWriting != 0) {
    PVar3 = PHYSFS_ERR_READ_ONLY;
LAB_0010d449:
    PHYSFS_setErrorCode(PVar3);
    return (void *)0x0;
  }
  PVar4 = (*io->tell)(io);
  if (PVar4 == 0xffffffffffffffff) {
    return (void *)0x0;
  }
  PVar5 = (*io->read)(io,&local_412e,6);
  if (PVar5 != 6) {
    return (void *)0x0;
  }
  *claimed = (uint)(local_412a == 0x1c27 && local_412e == -0x504385c9);
  iVar1 = (*io->seek)(io,PVar4);
  if (iVar1 == 0) {
    return (void *)0x0;
  }
  info = (SZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x108);
  if (info == (SZIPinfo *)0x0) {
    PVar3 = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_0010d449;
  }
  local_4150 = (CSzAr *)0x0;
  memset(info,0,0x108);
  info->io = io;
  local_4048 = &local_4080;
  local_4080 = SZIP_ISeekInStream_Read;
  local_4078 = SZIP_ISeekInStream_Seek;
  local_4068.Look = LookToRead_Look_Exact;
  local_4068.Skip = LookToRead_Skip;
  local_4068.Read = LookToRead_Read;
  local_4068.Seek = LookToRead_Seek;
  local_4040 = 0;
  uStack_4038 = 0;
  local_4070 = io;
  pCVar6 = (CSzAr *)(*io->tell)(io);
  rc = 0xb;
  if ((-1 < (long)pCVar6) &&
     (local_4150 = pCVar6, iVar1 = (*io->seek)(io,(PHYSFS_uint64)pCVar6), iVar1 != 0)) {
    pCVar9 = (CSzAr *)0x20;
    pCVar8 = (CSzAr *)local_40a8;
    do {
      local_4150 = pCVar8;
      local_40f8._0_8_ = pCVar9;
      rc = (*local_4068.Read)(&local_4068,pCVar8,(size_t *)&local_40f8);
      if (rc != 0) goto LAB_0010d859;
      if ((CSzAr *)local_40f8._0_8_ == (CSzAr *)0x0) {
        rc = 0x11;
        goto LAB_0010d859;
      }
      pCVar8 = (CSzAr *)((long)&pCVar8->NumPackStreams + local_40f8._0_8_);
      pCVar9 = (CSzAr *)((long)pCVar9 - local_40f8._0_8_);
    } while (pCVar9 != (CSzAr *)0x0);
    lVar7 = 0;
    do {
      if (local_40a8[lVar7] != SZIP_openArchive::wantedsig[lVar7]) goto LAB_0010d884;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    rc = 4;
    if (local_40a8[6] == '\0') {
      local_4150 = (CSzAr *)(local_40a8 + 0xc);
      local_4134 = local_408c;
      local_4110 = &pCVar6->FoCodersOffsets;
      (info->db).startPosAfterHeader = (UInt64)local_4110;
      UVar2 = (*g_CrcUpdate)(0xffffffff,local_4150,0x14,g_CrcTable);
      rc = 3;
      if ((UVar2 ^ local_40a8._8_4_) == 0xffffffff) {
        if (local_4094 == (CSzAr *)0x0) {
LAB_0010d92b:
          iVar1 = szipLoadEntries(info);
          if (iVar1 != 0) {
            return info;
          }
          goto LAB_0010d86f;
        }
        if (CARRY8(local_40a8._12_8_,(ulong)local_4094)) {
LAB_0010d884:
          rc = 0x11;
        }
        else {
          rc = 0x11;
          if ((ulong)local_40a8._12_8_ <= -(long)local_4094 - 0x21U) {
            local_4150 = &local_40f8;
            local_40f8._0_8_ = (CSzAr *)0x0;
            rc = (*local_4068.Seek)(&local_4068,(Int64 *)local_4150,SZ_SEEK_END);
            if ((((rc == 0) &&
                 (rc = 6, (CSzAr *)((long)&pCVar6->NumPackStreams + local_40a8._12_8_) <=
                          (ulong)local_40f8._0_8_)) &&
                (pCVar6 = (CSzAr *)((long)local_4110 + local_40a8._12_8_),
                pCVar6 <= (ulong)local_40f8._0_8_)) &&
               ((CSzAr *)((long)&pCVar6->NumPackStreams + (long)local_4094) <=
                (ulong)local_40f8._0_8_)) {
              local_4150 = &local_40f8;
              local_40f8._0_8_ = pCVar6;
              rc = (*local_4068.Seek)(&local_4068,(Int64 *)local_4150,SZ_SEEK_SET);
              if (rc == 0) {
                local_4150 = local_4094;
                pCVar6 = (CSzAr *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)local_4094);
                if (pCVar6 == (CSzAr *)0x0) {
                  rc = 2;
                }
                else {
                  pCVar8 = pCVar6;
                  pCVar9 = local_4094;
                  do {
                    local_40f8._0_8_ = pCVar9;
                    rc = (*local_4068.Read)(&local_4068,pCVar8,(size_t *)&local_40f8);
                    local_4150 = pCVar6;
                    if (rc != 0) goto LAB_0010d89b;
                    if ((CSzAr *)local_40f8._0_8_ == (CSzAr *)0x0) {
                      rc = 6;
                      goto LAB_0010d89b;
                    }
                    pCVar8 = (CSzAr *)((long)&pCVar8->NumPackStreams + local_40f8._0_8_);
                    pCVar9 = (CSzAr *)((long)pCVar9 - local_40f8._0_8_);
                  } while (pCVar9 != (CSzAr *)0x0);
                  allocMain = g_CrcTable;
                  UVar2 = (*g_CrcUpdate)(0xffffffff,pCVar6,(size_t)local_4094,g_CrcTable);
                  rc = 0x10;
                  if ((UVar2 ^ local_4134) == 0xffffffff) {
                    local_4108.Free = (_func_void_void_ptr_void_ptr *)local_4094;
                    local_4108.Alloc = (_func_void_ptr_void_ptr_size_t *)pCVar6;
                    rc = ReadNumber((CSzData *)&local_4108,&local_4140);
                    if ((rc == 0) && (local_4140 == 0x17)) {
                      local_4128.data = (Byte *)0x0;
                      local_4128.size = 0;
                      local_40f8._0_8_ = (CSzAr *)0x0;
                      local_40f8.PackPositions = (UInt64 *)0x0;
                      local_40f8.FolderCRCs.Defs = (Byte *)0x0;
                      local_40f8.FolderCRCs.Vals = (UInt32 *)0x0;
                      local_40f8.FoCodersOffsets = (size_t *)0x0;
                      local_40f8.FoStartPackStreamIndex = (UInt32 *)0x0;
                      local_40f8.FoToCoderUnpackSizes = (UInt32 *)0x0;
                      local_40f8.FoToMainUnpackSizeIndex = (Byte *)0x0;
                      local_40f8.CoderUnpackSizes = (UInt64 *)0x0;
                      local_40f8.CodersData = (Byte *)0x0;
                      in_R8 = (ISzAlloc *)(info->db).startPosAfterHeader;
                      alloc = &local_4108;
                      allocMain = (UInt32 *)0x1;
                      rc = SzReadAndDecodePackedStreams
                                     (&local_4068,(CSzData *)alloc,&local_4128,1,(UInt64)in_R8,
                                      &local_40f8,in_stack_ffffffffffffbea8);
                      SzAr_Free(&local_40f8,alloc);
                      if (rc == 0) {
                        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,pCVar6);
                        local_4150 = (CSzAr *)local_4128.data;
                        local_4108.Alloc = (_func_void_ptr_void_ptr_size_t *)local_4128.data;
                        local_4108.Free = (_func_void_void_ptr_void_ptr *)local_4128.size;
                        allocMain = (UInt32 *)local_4128.data;
                        rc = ReadNumber((CSzData *)&local_4108,&local_4140);
                      }
                      else {
                        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4128.data);
                      }
                    }
                    if ((rc == 0) && (rc = 4, local_4140 == 1)) {
                      rc = SzReadHeader(&info->db,(CSzData *)&local_4108,&local_4068,
                                        (ISzAlloc *)allocMain,in_R8);
                      (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4150);
                      if (rc == 0) goto LAB_0010d92b;
                      goto LAB_0010d859;
                    }
                  }
LAB_0010d89b:
                  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4150);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010d859:
  SzArEx_Free(&info->db,(ISzAlloc *)local_4150);
  PVar3 = szipErrorCode(rc);
  PHYSFS_setErrorCode(PVar3);
LAB_0010d86f:
  info->io = (PHYSFS_Io *)0x0;
  SZIP_closeArchive(info);
  return (void *)0x0;
}

Assistant:

static void *SZIP_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    static const PHYSFS_uint8 wantedsig[] = { '7','z',0xBC,0xAF,0x27,0x1C };
    SZIPLookToRead stream;
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPinfo *info = NULL;
    SRes rc;
    PHYSFS_uint8 sig[6];
    PHYSFS_sint64 pos;

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    pos = io->tell(io);
    BAIL_IF_ERRPASS(pos == -1, NULL);
    BAIL_IF_ERRPASS(io->read(io, sig, 6) != 6, NULL);
    *claimed = (memcmp(sig, wantedsig, 6) == 0);
    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    info = (SZIPinfo *) allocator.Malloc(sizeof (SZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (*info));

    SzArEx_Init(&info->db);

    info->io = io;

    szipInitStream(&stream, io);
    rc = SzArEx_Open(&info->db, &stream.lookStream.s, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), failed);

    GOTO_IF_ERRPASS(!szipLoadEntries(info), failed);

    return info;

failed:
    info->io = NULL;  /* don't let cleanup destroy the PHYSFS_Io. */
    SZIP_closeArchive(info);
    return NULL;
}